

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QGraphicsProxyWidget::focusInEvent(QGraphicsProxyWidget *this,QFocusEvent *event)

{
  QGraphicsProxyWidgetPrivate *this_00;
  Data *pDVar1;
  int iVar2;
  FocusReason reason;
  QWidget *pQVar3;
  bool next;
  
  this_00 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  if ((*(uint *)&this_00->field_0x244 >> 0xe & 1) != 0) {
    return;
  }
  *(ushort *)&this_00->field_0x244 = (ushort)*(uint *)&this_00->field_0x244 | 0x8000;
  iVar2 = QFocusEvent::reason();
  if (iVar2 == 2) {
    next = false;
LAB_005fba0b:
    pQVar3 = QGraphicsProxyWidgetPrivate::findFocusChild(this_00,(QWidget *)0x0,next);
    if (pQVar3 == (QWidget *)0x0) goto LAB_005fba70;
  }
  else {
    if (iVar2 == 1) {
      next = true;
      goto LAB_005fba0b;
    }
    pDVar1 = (this_00->widget).wp.d;
    if ((((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
        (pQVar3 = (QWidget *)(this_00->widget).wp.value, pQVar3 == (QWidget *)0x0)) ||
       (pQVar3 = QWidget::focusWidget(pQVar3), pQVar3 == (QWidget *)0x0)) goto LAB_005fba70;
    pQVar3 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value);
  }
  reason = QFocusEvent::reason();
  QWidget::setFocus(pQVar3,reason);
LAB_005fba70:
  pDVar1 = (this_00->widget).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((pQVar3 = (QWidget *)(this_00->widget).wp.value, pQVar3 != (QWidget *)0x0 &&
      ((pQVar3 = QWidget::focusWidget(pQVar3), pQVar3 != (QWidget *)0x0 &&
       (pQVar3 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value),
       (pQVar3->data->widget_attributes & 0x4000) != 0)))))) {
    QGuiApplication::inputMethod();
    QInputMethod::reset();
  }
  this_00->field_0x245 = this_00->field_0x245 & 0x7f;
  return;
}

Assistant:

T *data() const noexcept
    {
        return d;
    }